

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_7::setUniform
               (Functions *gl,deUint32 programID,char *name,float *value,int arraySize)

{
  GLint GVar1;
  GLenum err;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  GVar1 = (*gl->getUniformLocation)(programID,"s.b");
  (*gl->uniform1fv)(GVar1,3,(GLfloat *)name);
  err = (*gl->getError)();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Failed to set ",&local_61)
  ;
  std::operator+(&local_60,&local_40,"s.b");
  glu::checkError(err,local_60._M_dataplus._M_p,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderStructTests.cpp"
                  ,0x4bb);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void setUniform (const glw::Functions& gl, deUint32 programID, const char* name, const float* value, int arraySize)
{
	int loc = gl.getUniformLocation(programID, name);
	gl.uniform1fv(loc, arraySize, value);
	CHECK_SET_UNIFORM(name);
}